

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Quat4f __thiscall Quat4f::conjugated(Quat4f *this)

{
  float *in_RDI;
  Quat4f QVar1;
  
  QVar1.m_elements[2] = -this->m_elements[3];
  QVar1.m_elements[3] = -0.0;
  *in_RDI = this->m_elements[0];
  QVar1.m_elements._0_8_ = *(ulong *)(this->m_elements + 1) ^ 0x8000000080000000;
  *(ulong *)(in_RDI + 1) = QVar1.m_elements._0_8_;
  in_RDI[3] = QVar1.m_elements[2];
  return (Quat4f)QVar1.m_elements;
}

Assistant:

Quat4f Quat4f::conjugated() const
{
	return Quat4f
	(
		 m_elements[ 0 ],
		-m_elements[ 1 ],
		-m_elements[ 2 ],
		-m_elements[ 3 ]
	);
}